

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QGraphicsItem_*,_QPointF> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QPointF>>::findNode<QGraphicsItem*>
          (Data<QHashPrivate::Node<QGraphicsItem*,QPointF>> *this,QGraphicsItem **key)

{
  ulong uVar1;
  Node<QGraphicsItem_*,_QPointF> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QGraphicsItem*>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<QGraphicsItem_*,_QPointF> *)0x0;
  }
  else {
    pNVar2 = (Node<QGraphicsItem_*,_QPointF> *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }